

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GED_BasicGroundCombatSoldier
          (GED_BasicGroundCombatSoldier *this)

{
  DataTypeBase::DataTypeBase((DataTypeBase *)this);
  (this->super_GED).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicGroundCombatSoldier_002247f8;
  this->m_ui16EntityID = 0;
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EA);
  this->m_i16Offsets[2] = 0;
  this->m_i16Offsets[0] = 0;
  this->m_i16Offsets[1] = 0;
  this->m_i8Ori[0] = '\0';
  this->m_i8Ori[1] = '\0';
  this->m_i8Ori[2] = '\0';
  this->m_i8Spd = '\0';
  this->m_i8HdAz = '\0';
  this->m_i8HdElv = '\0';
  this->m_i8HdScanRt = '\0';
  this->m_i8HdElvRt = '\0';
  return;
}

Assistant:

GED_BasicGroundCombatSoldier::GED_BasicGroundCombatSoldier() :
    m_ui16EntityID( 0 ),
    m_i8Spd( 0 ),
    m_i8HdAz( 0 ),
    m_i8HdElv( 0 ),
    m_i8HdScanRt( 0 ),
    m_i8HdElvRt( 0 )
{
    for( KINT8 i = 0; i < 3; ++i )
    {
        m_i16Offsets[i] = 0;
        m_i8Ori[i] = 0;
    }
}